

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

int PlaneCodeToDistance(int xsize,int plane_code)

{
  int iVar1;
  int iVar2;
  
  if (0x78 < plane_code) {
    return plane_code + -0x78;
  }
  iVar2 = ((uint)((byte)(&DAT_001a3a5f)[plane_code] >> 4) * xsize -
          ((byte)(&DAT_001a3a5f)[plane_code] & 0xf)) + 8;
  iVar1 = 1;
  if (1 < iVar2) {
    iVar1 = iVar2;
  }
  return iVar1;
}

Assistant:

static WEBP_INLINE int PlaneCodeToDistance(int xsize, int plane_code) {
  if (plane_code > CODE_TO_PLANE_CODES) {
    return plane_code - CODE_TO_PLANE_CODES;
  } else {
    const int dist_code = kCodeToPlane[plane_code - 1];
    const int yoffset = dist_code >> 4;
    const int xoffset = 8 - (dist_code & 0xf);
    const int dist = yoffset * xsize + xoffset;
    return (dist >= 1) ? dist : 1;  // dist<1 can happen if xsize is very small
  }
}